

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_hash.c
# Opt level: O2

ion_err_t oah_find_item_loc(ion_hashmap_t *hash_map,ion_key_t key,int *location)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  
  iVar2 = (*hash_map->compute_hash)(hash_map,key,(hash_map->super).record.key_size);
  iVar3 = hash_map->map_size;
  iVar7 = 0;
  uVar5 = (long)iVar2 % (long)iVar3 & 0xffffffff;
  do {
    if (iVar7 == iVar3) {
      return '\x01';
    }
    iVar2 = (hash_map->super).record.key_size;
    iVar4 = (int)uVar5;
    lVar6 = (long)(((hash_map->super).record.value_size + iVar2 + 1) * iVar4);
    cVar1 = hash_map->entry[lVar6];
    if (cVar1 != -2) {
      if (cVar1 == -1) {
        return '\x01';
      }
      cVar1 = (*(hash_map->super).compare)(hash_map->entry + lVar6 + 1,key,iVar2);
      if (cVar1 == '\0') {
        *location = iVar4;
        return '\0';
      }
      iVar3 = hash_map->map_size;
    }
    iVar7 = iVar7 + 1;
    uVar5 = (ulong)(iVar4 + 1U);
    if (iVar3 <= (int)(iVar4 + 1U)) {
      uVar5 = 0;
    }
  } while( true );
}

Assistant:

ion_err_t
oah_find_item_loc(
	ion_hashmap_t	*hash_map,
	ion_key_t		key,
	int				*location
) {
	/* compute hash value for given key */
	ion_hash_t hash = hash_map->compute_hash(hash_map, key, hash_map->super.record.key_size);

	int loc			= oah_get_location(hash, hash_map->map_size);
	/* determine bucket based on hash */

	int count		= 0;

	while (count != hash_map->map_size) {
		/* check to see if current item is a match based on key */
		/* locate first item */
		ion_hash_bucket_t *item = (((ion_hash_bucket_t *) ((hash_map->entry + (hash_map->super.record.key_size + hash_map->super.record.value_size + SIZEOF(STATUS)) * loc))));

		if (item->status == ION_EMPTY) {
			return err_item_not_found;	/* if you hit an empty cell, exit */
		}
		else {
			/* calculate if there is a match */

			if (item->status != ION_DELETED) {
				int key_is_equal = hash_map->super.compare(item->data, key, hash_map->super.record.key_size);

				if (ION_IS_EQUAL == key_is_equal) {
					(*location) = loc;
					return err_ok;
				}
			}

			count++;
			loc++;

			if (loc >= hash_map->map_size) {
				/* Perform wrapping */
				loc = 0;
			}
		}
	}

	return err_item_not_found;	/* key have not been found */
}